

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestSha256.cpp
# Opt level: O3

void testSha256(void)

{
  code *pcVar1;
  int iVar2;
  byte checksum [32];
  byte check2 [32];
  byte check1 [32];
  byte abStack_78 [32];
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  undefined8 local_38;
  undefined8 uStack_30;
  undefined8 local_28;
  undefined8 uStack_20;
  
  local_28 = 0x4c939b64e441ae27;
  uStack_20 = 0x55b852781b9995a4;
  local_38 = 0x141cfc9842c4b0e3;
  uStack_30 = 0x24b96f99c8f4fb9a;
  Sha256::hash("",0,&abStack_78);
  iVar2 = Memory::compare(abStack_78,&local_38,0x20);
  if (iVar2 != 0) {
    iVar2 = Debug::printf("%s:%u: assertion failed: %s\n",
                          "/workspace/llm4binary/github/license_c_cmakelists/craflin[P]libnstd/test/UnitTest/TestSha256.cpp"
                          ,0xc,"Memory::compare(checksum, check1, sizeof(check1)) == 0");
    if (iVar2 != 0) goto LAB_0010273c;
  }
  local_48 = 0x9c147e05fb93baa9;
  uStack_40 = 0xa8507ae76d82ca96;
  local_58 = 0x878d4d6abe0f935c;
  uStack_50 = 0x306bad282d5b98d8;
  Sha256::hash((byte *)"But First, We Need to Talk About Parallel Universes",0x33,&abStack_78);
  iVar2 = Memory::compare(abStack_78,&local_58,0x20);
  if (iVar2 != 0) {
    iVar2 = Debug::printf("%s:%u: assertion failed: %s\n",
                          "/workspace/llm4binary/github/license_c_cmakelists/craflin[P]libnstd/test/UnitTest/TestSha256.cpp"
                          ,0x11,"Memory::compare(checksum, check2, sizeof(check2)) == 0");
    if (iVar2 != 0) {
LAB_0010273c:
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
  }
  return;
}

Assistant:

void testSha256()
{
  byte check1[Sha256::digestSize] = {
    0xe3, 0xb0, 0xc4, 0x42, 0x98, 0xfc, 0x1c, 0x14, 0x9a, 0xfb, 0xf4, 0xc8, 0x99, 0x6f, 0xb9, 0x24, 0x27, 0xae, 0x41, 0xe4, 0x64, 0x9b, 0x93, 0x4c, 0xa4, 0x95, 0x99, 0x1b, 0x78, 0x52, 0xb8, 0x55
  };
  byte checksum[Sha256::digestSize];
  Sha256::hash((const byte*)"", 0, checksum);
  ASSERT(Memory::compare(checksum, check1, sizeof(check1)) == 0);
  byte check2[Sha256::digestSize] = {
    0x5c, 0x93, 0x0f, 0xbe, 0x6a, 0x4d, 0x8d, 0x87, 0xd8, 0x98, 0x5b, 0x2d, 0x28, 0xad, 0x6b, 0x30, 0xa9, 0xba, 0x93, 0xfb, 0x05, 0x7e, 0x14, 0x9c, 0x96, 0xca, 0x82, 0x6d, 0xe7, 0x7a, 0x50, 0xa8
  };
  Sha256::hash((const byte*)"But First, We Need to Talk About Parallel Universes", 51, checksum);
  ASSERT(Memory::compare(checksum, check2, sizeof(check2)) == 0);
}